

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaCompressDXT.cpp
# Opt level: O2

void __thiscall nv::CudaCompressor::CudaCompressor(CudaCompressor *this)

{
  this->m_bitmapTable = (uint *)0x0;
  this->m_data = (uint *)0x0;
  this->m_result = (uint *)0x0;
  return;
}

Assistant:

CudaCompressor::CudaCompressor() : m_bitmapTable(NULL), m_data(NULL), m_result(NULL)
{
#if defined HAVE_CUDA
    // Allocate and upload bitmaps.
    cudaMalloc((void**) &m_bitmapTable, 992 * sizeof(uint));
	if (m_bitmapTable != NULL)
	{
		cudaMemcpy(m_bitmapTable, s_bitmapTable, 992 * sizeof(uint), cudaMemcpyHostToDevice);
	}

	// Allocate scratch buffers.
    cudaMalloc((void**) &m_data, MAX_BLOCKS * 64U);
    cudaMalloc((void**) &m_result, MAX_BLOCKS * 8U);
#endif
}